

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

bool rcg::anon_unknown_6::getStreamBool
               (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,STREAM_INFO_CMD cmd)

{
  bool8_t ret;
  size_t size;
  INFO_DATATYPE type;
  byte local_19;
  size_t local_18;
  INFO_DATATYPE local_c;
  
  local_19 = 0;
  local_18 = 1;
  if (stream == (void *)0x0) {
    local_19 = 0;
  }
  else {
    (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      DSGetInfo)(stream,cmd,&local_c,&local_19,&local_18);
  }
  return (bool)(local_19 & 1);
}

Assistant:

inline bool getStreamBool(const std::shared_ptr<const GenTLWrapper> &gentl,
                          void *stream, GenTL::STREAM_INFO_CMD cmd)
{
  bool8_t ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(ret);

  if (stream != 0)
  {
    gentl->DSGetInfo(stream, cmd, &type, &ret, &size);
  }

  return ret != 0;
}